

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O3

void Mig_ManStop(Mig_Man_t *p)

{
  int *piVar1;
  void **__ptr;
  uint uVar2;
  Mig_Obj_t *__ptr_00;
  
  piVar1 = (p->vTravIds).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTravIds).pArray = (int *)0x0;
  }
  piVar1 = (p->vCopies).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCopies).pArray = (int *)0x0;
  }
  piVar1 = (p->vLevels).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vLevels).pArray = (int *)0x0;
  }
  piVar1 = (p->vRefs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vRefs).pArray = (int *)0x0;
  }
  piVar1 = (p->vSibls).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vSibls).pArray = (int *)0x0;
  }
  p->iPage = 0;
  if (0 < (p->vPages).nSize) {
    uVar2 = 0;
    do {
      if ((int)uVar2 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      __ptr_00 = (Mig_Obj_t *)((long)(p->vPages).pArray[uVar2] + -0x10);
      p->pPage = __ptr_00;
      free(__ptr_00);
      p->pPage = (Mig_Obj_t *)0x0;
      uVar2 = p->iPage + 1;
      p->iPage = uVar2;
    } while ((int)uVar2 < (p->vPages).nSize);
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar1 = (p->vCis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCis).pArray = (int *)0x0;
  }
  piVar1 = (p->vCos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCos).pArray = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
  }
  free(p);
  return;
}

Assistant:

void Mig_ManStop( Mig_Man_t * p )
{
    if ( 0 )
    printf( "Subject graph uses %d pages of %d objects with %d entries. Total memory = %.2f MB.\n", 
        Vec_PtrSize(&p->vPages), MIG_MASK + 1, p->nObjs,
        1.0 * Vec_PtrSize(&p->vPages) * (MIG_MASK + 1) * 16 / (1 << 20) );
    // attributes
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vRefs.pArray );
    ABC_FREE( p->vSibls.pArray );
    // pages
    Vec_PtrForEachEntry( Mig_Obj_t *, &p->vPages, p->pPage, p->iPage )
        --p->pPage, ABC_FREE( p->pPage );
    // objects
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}